

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmdif.c
# Opt level: O0

int lmdif_cvkit(S_fp fcn,integer *m,integer *n,doublereal *x,doublereal *fvec,doublereal *ftol,
               doublereal *xtol,doublereal *gtol,integer *maxfev,doublereal *epsfcn,doublereal *diag
               ,integer *mode,doublereal *factor,integer *nprint,integer *info,integer *nfev,
               doublereal *fjac,integer *ldfjac,integer *ipvt,doublereal *qtf,doublereal *wa1,
               doublereal *wa2,doublereal *wa3,doublereal *wa4,void *up)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  doublereal *wa1_00;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  doublereal *wa2_00;
  doublereal *par_00;
  long lVar8;
  doublereal *pdVar9;
  long in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  code *in_RDI;
  long in_R8;
  double *in_R9;
  integer *m_00;
  integer *m_01;
  doublereal dVar10;
  double dVar11;
  doublereal *x_00;
  double *in_stack_00000008;
  double *in_stack_00000010;
  long *in_stack_00000018;
  undefined8 in_stack_00000020;
  long in_stack_00000028;
  long *in_stack_00000030;
  double *in_stack_00000038;
  long *in_stack_00000040;
  long *in_stack_00000048;
  long *in_stack_00000050;
  long in_stack_00000058;
  long *in_stack_00000060;
  long in_stack_00000068;
  long in_stack_00000070;
  doublereal sum;
  doublereal par;
  doublereal prered;
  doublereal epsmch;
  doublereal dirder;
  doublereal actred;
  doublereal fnorm1;
  doublereal xnorm;
  doublereal pnorm;
  doublereal gnorm;
  doublereal fnorm;
  doublereal ratio;
  doublereal delta;
  integer iflag;
  integer fret;
  integer l;
  integer j;
  integer i__;
  doublereal temp2;
  doublereal temp1;
  doublereal temp;
  integer iter;
  doublereal d__3;
  doublereal d__2;
  doublereal d__1;
  integer i__2;
  integer i__1;
  integer fjac_offset;
  integer fjac_dim1;
  long *plVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined8 uVar15;
  doublereal dVar16;
  doublereal dVar17;
  doublereal dVar18;
  integer *local_178;
  integer *local_170;
  integer *local_168;
  doublereal *local_160;
  doublereal *local_148;
  doublereal *in_stack_fffffffffffffec8;
  doublereal *in_stack_fffffffffffffed0;
  integer *in_stack_fffffffffffffee0;
  S_fp in_stack_fffffffffffffef0;
  integer *in_stack_fffffffffffffef8;
  integer *in_stack_ffffffffffffff00;
  integer *iflag_00;
  doublereal *in_stack_ffffffffffffff10;
  doublereal *in_stack_ffffffffffffff18;
  doublereal local_d8;
  doublereal *in_stack_ffffffffffffff30;
  doublereal *rdiag;
  doublereal *in_stack_ffffffffffffff48;
  long local_b0;
  long local_a8;
  doublereal *in_stack_ffffffffffffff68;
  doublereal *diag_00;
  integer *ipvt_00;
  doublereal *in_stack_ffffffffffffff80;
  doublereal *in_stack_ffffffffffffff88;
  doublereal *in_stack_ffffffffffffff90;
  doublereal *delta_00;
  doublereal *x_01;
  
  diag_00 = (doublereal *)0x0;
  iflag_00 = (integer *)0x0;
  lVar3 = (long)epsmch + -8;
  wa1_00 = (doublereal *)(in_R8 + -8);
  lVar4 = (long)prered + -8;
  lVar5 = (long)par + -8;
  lVar6 = (long)sum + -8;
  lVar7 = in_stack_00000028 + -8;
  wa2_00 = (doublereal *)(in_RCX + -8);
  x_01 = (doublereal *)*in_stack_00000060;
  par_00 = (doublereal *)((long)x_01 + 1);
  lVar8 = in_stack_00000058 + (long)par_00 * -8;
  m_00 = (integer *)dpmpar_cvkit(&c__1);
  *in_stack_00000048 = 0;
  rdiag = (doublereal *)0x0;
  *in_stack_00000050 = 0;
  if ((((0 < (long)*in_RDX) && ((long)*in_RDX <= (long)*in_RSI)) &&
      ((long)*in_RSI <= *in_stack_00000060)) &&
     (((lmdif_cvkit::zero <= *in_R9 && (lmdif_cvkit::zero <= *in_stack_00000008)) &&
      ((lmdif_cvkit::zero <= *in_stack_00000010 &&
       ((0 < *in_stack_00000018 && (lmdif_cvkit::zero < *in_stack_00000038)))))))) {
    if (*in_stack_00000030 == 2) {
      for (local_b0 = 1; local_b0 <= (long)*in_RDX; local_b0 = local_b0 + 1) {
        if (*(double *)(lVar7 + local_b0 * 8) <= lmdif_cvkit::zero) goto LAB_001c4ff0;
      }
    }
    rdiag = (doublereal *)0x1;
    iVar2 = (*in_RDI)(*in_RDX & 0xffffffff,wa2_00 + 1,*in_RSI & 0xffffffff,wa1_00 + 1,dirder);
    pdVar9 = (doublereal *)(long)iVar2;
    if ((long)pdVar9 < 0) {
      rdiag = pdVar9;
    }
    *in_stack_00000050 = 1;
    if (-1 < (long)rdiag) {
      m_01 = (integer *)enorm_cvkit((integer *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      ipvt_00 = (integer *)0x1;
      x_00 = (doublereal *)lmdif_cvkit::zero;
      while( true ) {
        rdiag = (doublereal *)0x2;
        puVar13 = &stack0xffffffffffffff38;
        plVar12 = in_stack_00000060;
        uVar15 = in_stack_00000020;
        dVar10 = epsmch;
        dVar16 = dirder;
        fdjac2_cvkit(in_stack_fffffffffffffef0,m_00,in_stack_fffffffffffffee0,x_00,
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_ffffffffffffff00,
                     iflag_00,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,m_01);
        *in_stack_00000050 = *in_RDX + *in_stack_00000050;
        if ((long)rdiag < 0) break;
        if (0 < *in_stack_00000040) {
          rdiag = (doublereal *)0x0;
          if (((long)ipvt_00 + -1) % *in_stack_00000040 == 0) {
            iVar2 = (*in_RDI)(*in_RDX & 0xffffffff,wa2_00 + 1,*in_RSI & 0xffffffff,wa1_00 + 1,dirder
                              ,in_RDI,plVar12,puVar13,uVar15,dVar10,dVar16);
            pdVar9 = (doublereal *)(long)iVar2;
            if ((long)pdVar9 < 0) {
              rdiag = pdVar9;
            }
          }
          if ((long)rdiag < 0) break;
        }
        qrfac_cvkit(m_01,(integer *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,iflag_00,
                    in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                    (integer *)in_stack_ffffffffffffff30,rdiag,pdVar9,in_stack_ffffffffffffff48);
        if (ipvt_00 == (integer *)0x1) {
          if (*in_stack_00000030 != 2) {
            uVar1 = *in_RDX;
            for (local_b0 = 1; local_b0 <= (long)uVar1; local_b0 = local_b0 + 1) {
              *(undefined8 *)(lVar7 + local_b0 * 8) = *(undefined8 *)(lVar5 + local_b0 * 8);
              dVar11 = *(double *)(lVar5 + local_b0 * 8);
              if ((dVar11 == lmdif_cvkit::zero) && (!NAN(dVar11) && !NAN(lmdif_cvkit::zero))) {
                *(doublereal *)(lVar7 + local_b0 * 8) = lmdif_cvkit::one;
              }
            }
          }
          uVar1 = *in_RDX;
          for (local_b0 = 1; local_b0 <= (long)uVar1; local_b0 = local_b0 + 1) {
            *(double *)(lVar4 + local_b0 * 8) = *(double *)(lVar7 + local_b0 * 8) * wa2_00[local_b0]
            ;
          }
          iflag_00 = (integer *)
                     enorm_cvkit((integer *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          in_stack_ffffffffffffff30 = (doublereal *)(*in_stack_00000038 * (double)iflag_00);
          if (((double)in_stack_ffffffffffffff30 == lmdif_cvkit::zero) &&
             (!NAN((double)in_stack_ffffffffffffff30) && !NAN(lmdif_cvkit::zero))) {
            in_stack_ffffffffffffff30 = (doublereal *)*in_stack_00000038;
          }
        }
        uVar1 = *in_RSI;
        for (local_a8 = 1; local_a8 <= (long)uVar1; local_a8 = local_a8 + 1) {
          *(doublereal *)(lVar3 + local_a8 * 8) = wa1_00[local_a8];
        }
        delta_00 = (doublereal *)*in_RDX;
        for (local_b0 = 1; local_b0 <= (long)delta_00; local_b0 = local_b0 + 1) {
          dVar11 = *(double *)(lVar8 + (local_b0 + local_b0 * (long)x_01) * 8);
          if ((dVar11 != lmdif_cvkit::zero) || (NAN(dVar11) || NAN(lmdif_cvkit::zero))) {
            in_stack_fffffffffffffed0 = (doublereal *)lmdif_cvkit::zero;
            for (local_a8 = local_b0; local_a8 <= (long)*in_RSI; local_a8 = local_a8 + 1) {
              in_stack_fffffffffffffed0 =
                   (doublereal *)
                   (*(double *)(lVar8 + (local_a8 + local_b0 * (long)x_01) * 8) *
                    *(double *)(lVar3 + local_a8 * 8) + (double)in_stack_fffffffffffffed0);
            }
            diag_00 = (doublereal *)
                      (-(double)in_stack_fffffffffffffed0 /
                      *(double *)(lVar8 + (local_b0 + local_b0 * (long)x_01) * 8));
            uVar1 = *in_RSI;
            for (local_a8 = local_b0; local_a8 <= (long)uVar1; local_a8 = local_a8 + 1) {
              *(double *)(lVar3 + local_a8 * 8) =
                   *(double *)(lVar8 + (local_a8 + local_b0 * (long)x_01) * 8) * (double)diag_00 +
                   *(double *)(lVar3 + local_a8 * 8);
            }
          }
          *(undefined8 *)(lVar8 + (local_b0 + local_b0 * (long)x_01) * 8) =
               *(undefined8 *)(lVar6 + local_b0 * 8);
          *(undefined8 *)(in_stack_00000070 + -8 + local_b0 * 8) =
               *(undefined8 *)(lVar3 + local_b0 * 8);
        }
        in_stack_ffffffffffffff18 = (doublereal *)lmdif_cvkit::zero;
        if (((double)m_01 != lmdif_cvkit::zero) || (NAN((double)m_01) || NAN(lmdif_cvkit::zero))) {
          delta_00 = (doublereal *)*in_RDX;
          for (local_b0 = 1; local_b0 <= (long)delta_00; local_b0 = local_b0 + 1) {
            in_stack_ffffffffffffff48 = *(doublereal **)(in_stack_00000068 + -8 + local_b0 * 8);
            dVar11 = *(double *)(lVar5 + (long)in_stack_ffffffffffffff48 * 8);
            if ((dVar11 != lmdif_cvkit::zero) ||
               (pdVar9 = in_stack_ffffffffffffff18, NAN(dVar11) || NAN(lmdif_cvkit::zero))) {
              in_stack_fffffffffffffed0 = (doublereal *)lmdif_cvkit::zero;
              for (local_a8 = 1; local_a8 <= local_b0; local_a8 = local_a8 + 1) {
                in_stack_fffffffffffffed0 =
                     (doublereal *)
                     (*(double *)(lVar8 + (local_a8 + local_b0 * (long)x_01) * 8) *
                      (*(double *)(in_stack_00000070 + -8 + local_a8 * 8) / (double)m_01) +
                     (double)in_stack_fffffffffffffed0);
              }
              in_stack_ffffffffffffff90 =
                   (doublereal *)
                   ((double)in_stack_fffffffffffffed0 /
                   *(double *)(lVar5 + (long)in_stack_ffffffffffffff48 * 8));
              in_stack_fffffffffffffec8 = in_stack_ffffffffffffff90;
              if ((double)in_stack_ffffffffffffff90 < 0.0) {
                in_stack_fffffffffffffec8 = (doublereal *)-(double)in_stack_ffffffffffffff90;
              }
              pdVar9 = in_stack_fffffffffffffec8;
              in_stack_ffffffffffffff80 = in_stack_fffffffffffffec8;
              in_stack_ffffffffffffff88 = in_stack_ffffffffffffff18;
              if ((double)in_stack_fffffffffffffec8 <= (double)in_stack_ffffffffffffff18) {
                pdVar9 = in_stack_ffffffffffffff18;
              }
            }
            in_stack_ffffffffffffff18 = pdVar9;
          }
        }
        if ((double)in_stack_ffffffffffffff18 <= *in_stack_00000010) {
          *in_stack_00000048 = 4;
        }
        if (*in_stack_00000048 != 0) break;
        if (*in_stack_00000030 != 2) {
          delta_00 = (doublereal *)*in_RDX;
          for (local_b0 = 1; local_b0 <= (long)delta_00; local_b0 = local_b0 + 1) {
            in_stack_ffffffffffffff90 = *(doublereal **)(lVar7 + local_b0 * 8);
            in_stack_ffffffffffffff88 = *(doublereal **)(lVar5 + local_b0 * 8);
            local_148 = in_stack_ffffffffffffff88;
            if ((double)in_stack_ffffffffffffff88 <= (double)in_stack_ffffffffffffff90) {
              local_148 = in_stack_ffffffffffffff90;
            }
            *(doublereal **)(lVar7 + local_b0 * 8) = local_148;
          }
        }
        do {
          puVar13 = &stack0xffffffffffffff30;
          puVar14 = &stack0xfffffffffffffed8;
          dVar10 = sum;
          dVar16 = par;
          dVar17 = prered;
          dVar18 = epsmch;
          lmpar_cvkit((integer *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                      (integer *)in_stack_ffffffffffffff80,ipvt_00,diag_00,in_stack_ffffffffffffff68
                      ,delta_00,par_00,x_01,in_R9,wa1_00,wa2_00);
          uVar1 = *in_RDX;
          for (local_b0 = 1; local_b0 <= (long)uVar1; local_b0 = local_b0 + 1) {
            *(ulong *)(lVar6 + local_b0 * 8) = *(ulong *)(lVar6 + local_b0 * 8) ^ 0x8000000000000000
            ;
            *(double *)(lVar5 + local_b0 * 8) = wa2_00[local_b0] + *(double *)(lVar6 + local_b0 * 8)
            ;
            *(double *)(lVar4 + local_b0 * 8) =
                 *(double *)(lVar7 + local_b0 * 8) * *(double *)(lVar6 + local_b0 * 8);
          }
          in_stack_ffffffffffffff10 =
               (doublereal *)
               enorm_cvkit((integer *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          in_stack_ffffffffffffff90 = in_stack_ffffffffffffff30;
          if ((ipvt_00 == (integer *)0x1) &&
             (in_stack_ffffffffffffff90 = in_stack_ffffffffffffff10,
             (double)in_stack_ffffffffffffff30 <= (double)in_stack_ffffffffffffff10)) {
            in_stack_ffffffffffffff90 = in_stack_ffffffffffffff30;
          }
          rdiag = (doublereal *)0x1;
          iVar2 = (*in_RDI)(*in_RDX & 0xffffffff,par,*in_RSI & 0xffffffff,epsmch,dirder,in_RDI,
                            puVar13,puVar14,dVar10,dVar16,dVar17,dVar18);
          pdVar9 = (doublereal *)(long)iVar2;
          if ((long)iVar2 < 0) {
            pdVar9 = rdiag;
          }
          *in_stack_00000050 = *in_stack_00000050 + 1;
          if ((long)rdiag < 0) goto LAB_001c4ff0;
          in_stack_ffffffffffffff00 =
               (integer *)
               enorm_cvkit((integer *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          in_stack_fffffffffffffef8 = (integer *)((ulong)lmdif_cvkit::one ^ 0x8000000000000000);
          if (lmdif_cvkit::p1 * (double)in_stack_ffffffffffffff00 < (double)m_01) {
            in_stack_fffffffffffffef8 =
                 (integer *)
                 (-((double)in_stack_ffffffffffffff00 / (double)m_01) *
                  ((double)in_stack_ffffffffffffff00 / (double)m_01) + lmdif_cvkit::one);
          }
          delta_00 = (doublereal *)*in_RDX;
          for (local_b0 = 1; local_b0 <= (long)delta_00; local_b0 = local_b0 + 1) {
            *(doublereal *)(lVar4 + local_b0 * 8) = lmdif_cvkit::zero;
            in_stack_ffffffffffffff48 = *(doublereal **)(in_stack_00000068 + -8 + local_b0 * 8);
            diag_00 = *(doublereal **)(lVar6 + (long)in_stack_ffffffffffffff48 * 8);
            for (local_a8 = 1; local_a8 <= local_b0; local_a8 = local_a8 + 1) {
              *(double *)(lVar4 + local_a8 * 8) =
                   *(double *)(lVar8 + (local_a8 + local_b0 * (long)x_01) * 8) * (double)diag_00 +
                   *(double *)(lVar4 + local_a8 * 8);
            }
          }
          dVar10 = enorm_cvkit((integer *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          in_stack_ffffffffffffff68 = (doublereal *)(dVar10 / (double)m_01);
          dVar11 = sqrt((double)x_00);
          in_stack_ffffffffffffff88 =
               (doublereal *)((dVar11 * (double)in_stack_ffffffffffffff10) / (double)m_01);
          in_stack_fffffffffffffee0 =
               (integer *)
               ((double)in_stack_ffffffffffffff68 * (double)in_stack_ffffffffffffff68 +
               ((double)in_stack_ffffffffffffff88 * (double)in_stack_ffffffffffffff88) /
               lmdif_cvkit::p5);
          in_stack_fffffffffffffef0 =
               (S_fp)-((double)in_stack_ffffffffffffff68 * (double)in_stack_ffffffffffffff68 +
                      (double)in_stack_ffffffffffffff88 * (double)in_stack_ffffffffffffff88);
          local_d8 = lmdif_cvkit::zero;
          if (((double)in_stack_fffffffffffffee0 != lmdif_cvkit::zero) ||
             (NAN((double)in_stack_fffffffffffffee0) || NAN(lmdif_cvkit::zero))) {
            local_d8 = (double)in_stack_fffffffffffffef8 / (double)in_stack_fffffffffffffee0;
          }
          if (local_d8 <= lmdif_cvkit::p25) {
            diag_00 = (doublereal *)lmdif_cvkit::p5;
            if ((double)in_stack_fffffffffffffef8 < lmdif_cvkit::zero) {
              diag_00 = (doublereal *)
                        ((lmdif_cvkit::p5 * (double)in_stack_fffffffffffffef0) /
                        (lmdif_cvkit::p5 * (double)in_stack_fffffffffffffef8 +
                        (double)in_stack_fffffffffffffef0));
            }
            if (((double)m_01 <= lmdif_cvkit::p1 * (double)in_stack_ffffffffffffff00) ||
               ((double)diag_00 < lmdif_cvkit::p1)) {
              diag_00 = (doublereal *)lmdif_cvkit::p1;
            }
            in_stack_ffffffffffffff88 =
                 (doublereal *)((double)in_stack_ffffffffffffff10 / lmdif_cvkit::p1);
            local_160 = in_stack_ffffffffffffff88;
            if ((double)in_stack_ffffffffffffff90 <= (double)in_stack_ffffffffffffff88) {
              local_160 = in_stack_ffffffffffffff90;
            }
            x_00 = (doublereal *)((double)x_00 / (double)diag_00);
            in_stack_ffffffffffffff30 = (doublereal *)((double)diag_00 * (double)local_160);
          }
          else if ((((double)x_00 == lmdif_cvkit::zero) &&
                   (!NAN((double)x_00) && !NAN(lmdif_cvkit::zero))) ||
                  (in_stack_ffffffffffffff30 = in_stack_ffffffffffffff90,
                  in_stack_ffffffffffffff90 = in_stack_ffffffffffffff68,
                  lmdif_cvkit::p75 <= local_d8)) {
            x_00 = (doublereal *)(lmdif_cvkit::p5 * (double)x_00);
            in_stack_ffffffffffffff30 =
                 (doublereal *)((double)in_stack_ffffffffffffff10 / lmdif_cvkit::p5);
            in_stack_ffffffffffffff90 = in_stack_ffffffffffffff68;
          }
          if (lmdif_cvkit::p0001 <= local_d8) {
            uVar1 = *in_RDX;
            for (local_b0 = 1; local_b0 <= (long)uVar1; local_b0 = local_b0 + 1) {
              wa2_00[local_b0] = *(doublereal *)(lVar5 + local_b0 * 8);
              *(double *)(lVar5 + local_b0 * 8) =
                   *(double *)(lVar7 + local_b0 * 8) * wa2_00[local_b0];
            }
            delta_00 = (doublereal *)*in_RSI;
            for (local_a8 = 1; local_a8 <= (long)delta_00; local_a8 = local_a8 + 1) {
              wa1_00[local_a8] = *(doublereal *)(lVar3 + local_a8 * 8);
            }
            iflag_00 = (integer *)
                       enorm_cvkit((integer *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            ipvt_00 = (integer *)((long)ipvt_00 + 1);
            m_01 = in_stack_ffffffffffffff00;
          }
          local_168 = in_stack_fffffffffffffef8;
          if ((double)in_stack_fffffffffffffef8 < 0.0) {
            local_168 = (integer *)((ulong)in_stack_fffffffffffffef8 ^ 0x8000000000000000);
          }
          if ((((double)local_168 <= *in_R9) && ((double)in_stack_fffffffffffffee0 <= *in_R9)) &&
             (lmdif_cvkit::p5 * local_d8 <= lmdif_cvkit::one)) {
            *in_stack_00000048 = 1;
          }
          if ((double)in_stack_ffffffffffffff30 <= *in_stack_00000008 * (double)iflag_00) {
            *in_stack_00000048 = 2;
          }
          local_170 = in_stack_fffffffffffffef8;
          if ((double)in_stack_fffffffffffffef8 < 0.0) {
            local_170 = (integer *)((ulong)in_stack_fffffffffffffef8 ^ 0x8000000000000000);
          }
          if ((((double)local_170 <= *in_R9) && ((double)in_stack_fffffffffffffee0 <= *in_R9)) &&
             ((lmdif_cvkit::p5 * local_d8 <= lmdif_cvkit::one && (*in_stack_00000048 == 2)))) {
            *in_stack_00000048 = 3;
          }
          if (*in_stack_00000048 != 0) goto LAB_001c4ff0;
          if (*in_stack_00000018 <= *in_stack_00000050) {
            *in_stack_00000048 = 5;
          }
          local_178 = in_stack_fffffffffffffef8;
          if ((double)in_stack_fffffffffffffef8 < 0.0) {
            local_178 = (integer *)((ulong)in_stack_fffffffffffffef8 ^ 0x8000000000000000);
          }
          if ((((double)local_178 <= (double)m_00) &&
              ((double)in_stack_fffffffffffffee0 <= (double)m_00)) &&
             (lmdif_cvkit::p5 * local_d8 <= lmdif_cvkit::one)) {
            *in_stack_00000048 = 6;
          }
          if ((double)in_stack_ffffffffffffff30 <= (double)m_00 * (double)iflag_00) {
            *in_stack_00000048 = 7;
          }
          if ((double)in_stack_ffffffffffffff18 <= (double)m_00) {
            *in_stack_00000048 = 8;
          }
          if (*in_stack_00000048 != 0) goto LAB_001c4ff0;
        } while (local_d8 < lmdif_cvkit::p0001);
      }
    }
  }
LAB_001c4ff0:
  if ((long)rdiag < 0) {
    *in_stack_00000048 = (long)rdiag;
  }
  if (0 < *in_stack_00000040) {
    (*in_RDI)(*in_RDX & 0xffffffff,wa2_00 + 1,*in_RSI & 0xffffffff,wa1_00 + 1);
  }
  return 0;
}

Assistant:

int lmdif_cvkit(S_fp fcn, integer *m, integer *n, doublereal *x,
	doublereal *fvec, doublereal *ftol, doublereal *xtol, doublereal *
	gtol, integer *maxfev, doublereal *epsfcn, doublereal *diag, integer *
	mode, doublereal *factor, integer *nprint, integer *info, integer *
	nfev, doublereal *fjac, integer *ldfjac, integer *ipvt, doublereal *
	qtf, doublereal *wa1, doublereal *wa2, doublereal *wa3, doublereal *
	wa4, void *up)
{
    /* Initialized data */

    static doublereal one = 1.;
    static doublereal p1 = .1;
    static doublereal p5 = .5;
    static doublereal p25 = .25;
    static doublereal p75 = .75;
    static doublereal p0001 = 1e-4;
    static doublereal zero = 0.;

    /* System generated locals */
    integer fjac_dim1, fjac_offset, i__1, i__2;
    doublereal d__1, d__2, d__3;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    integer iter;
    doublereal temp=0, temp1, temp2;
    integer i__, j, l, fret, iflag;
    doublereal delta;
    extern /* Subroutine */ int qrfac_cvkit(integer *, integer *, doublereal *,
	    integer *, logical *, integer *, integer *, doublereal *,
	    doublereal *, doublereal *), lmpar_cvkit(integer *, doublereal *,
	    integer *, integer *, doublereal *, doublereal *, doublereal *,
	    doublereal *, doublereal *, doublereal *, doublereal *,
	    doublereal *);
    doublereal ratio;
    extern doublereal enorm_cvkit(integer *, doublereal *);
    doublereal fnorm, gnorm;
    extern /* Subroutine */ int fdjac2_cvkit(S_fp, integer *, integer *,
	    doublereal *, doublereal *, doublereal *, integer *, integer *,
	    doublereal *, doublereal *, void *);
    doublereal pnorm, xnorm=0, fnorm1, actred, dirder, epsmch, prered;
    extern doublereal dpmpar_cvkit(integer *);
    doublereal par, sum;

/*<       integer m,n,maxfev,mode,nprint,info,nfev,ldfjac >*/
/*<       integer ipvt(n) >*/
/*<       double precision ftol,xtol,gtol,epsfcn,factor >*/
/*<    >*/
/*<       external fcn >*/
/*     ********** */

/*     subroutine lmdif */

/*     the purpose of lmdif is to minimize the sum of the squares of */
/*     m nonlinear functions in n variables by a modification of */
/*     the levenberg-marquardt algorithm. the user must provide a */
/*     subroutine which calculates the functions. the jacobian is */
/*     then calculated by a forward-difference approximation. */

/*     the subroutine statement is */

/*       subroutine mp_lmdif(fcn,m,n,x,fvec,ftol,xtol,gtol,maxfev,epsfcn, */
/*                        diag,mode,factor,nprint,info,nfev,fjac, */
/*                        ldfjac,ipvt,qtf,wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions. fcn must be declared */
/*         in an external statement in the user calling */
/*         program, and should be written as follows. */

/*         subroutine fcn(m,n,x,fvec,iflag) */
/*         integer m,n,iflag */
/*         double precision x(n),fvec(m) */
/*         ---------- */
/*         calculate the functions at x and */
/*         return this vector in fvec. */
/*         ---------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of lmdif. */
/*         in this case set iflag to a negative integer. */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. n must not exceed m. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length m which contains */
/*         the functions evaluated at the output x. */

/*       ftol is a nonnegative input variable. termination */
/*         occurs when both the actual and predicted relative */
/*         reductions in the sum of squares are at most ftol. */
/*         therefore, ftol measures the relative error desired */
/*         in the sum of squares. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. therefore, xtol measures the */
/*         relative error desired in the approximate solution. */

/*       gtol is a nonnegative input variable. termination */
/*         occurs when the cosine of the angle between fvec and */
/*         any column of the jacobian is at most gtol in absolute */
/*         value. therefore, gtol measures the orthogonality */
/*         desired between the function vector and the columns */
/*         of the jacobian. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn is at least */
/*         maxfev by the end of an iteration. */

/*       epsfcn is an input variable used in determining a suitable */
/*         step length for the forward-difference approximation. this */
/*         approximation assumes that the relative errors in the */
/*         functions are of the order of epsfcn. if epsfcn is less */
/*         than the machine precision, it is assumed that the relative */
/*         errors in the functions are of the order of the machine */
/*         precision. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.). 100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x and fvec available */
/*         for printing. if nprint is not positive, no special calls */
/*         of fcn with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0  improper input parameters. */

/*         info = 1  both actual and predicted relative reductions */
/*                   in the sum of squares are at most ftol. */

/*         info = 2  relative error between two consecutive iterates */
/*                   is at most xtol. */

/*         info = 3  conditions for info = 1 and info = 2 both hold. */

/*         info = 4  the cosine of the angle between fvec and any */
/*                   column of the jacobian is at most gtol in */
/*                   absolute value. */

/*         info = 5  number of calls to fcn has reached or */
/*                   exceeded maxfev. */

/*         info = 6  ftol is too small. no further reduction in */
/*                   the sum of squares is possible. */

/*         info = 7  xtol is too small. no further improvement in */
/*                   the approximate solution x is possible. */

/*         info = 8  gtol is too small. fvec is orthogonal to the */
/*                   columns of the jacobian to machine precision. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn. */

/*       fjac is an output m by n array. the upper n by n submatrix */
/*         of fjac contains an upper triangular matrix r with */
/*         diagonal elements of nonincreasing magnitude such that */

/*                t     t           t */
/*               p *(jac *jac)*p = r *r, */

/*         where p is a permutation matrix and jac is the final */
/*         calculated jacobian. column j of p is column ipvt(j) */
/*         (see below) of the identity matrix. the lower trapezoidal */
/*         part of fjac contains information generated during */
/*         the computation of r. */

/*       ldfjac is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       ipvt is an integer output array of length n. ipvt */
/*         defines a permutation matrix p such that jac*p = q*r, */
/*         where jac is the final calculated jacobian, q is */
/*         orthogonal (not stored), and r is upper triangular */
/*         with diagonal elements of nonincreasing magnitude. */
/*         column j of p is column ipvt(j) of the identity matrix. */

/*       qtf is an output array of length n which contains */
/*         the first n elements of the vector (q transpose)*fvec. */

/*       wa1, wa2, and wa3 are work arrays of length n. */

/*       wa4 is a work array of length m. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dpmpar,enorm,fdjac2,lmpar,qrfac */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
/*<       integer i,iflag,iter,j,l >*/
/*<    >*/
/*<       double precision dpmpar,enorm >*/
/*<    >*/
    /* Parameter adjustments */
    --wa4;
    --fvec;
    --wa3;
    --wa2;
    --wa1;
    --qtf;
    --ipvt;
    --diag;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;

    /* Function Body */

/*     epsmch is the machine precision. */

/*<       epsmch = dpmpar(1) >*/
    epsmch = dpmpar_cvkit(&c__1);

/*<       info = 0 >*/
    *info = 0;
/*<       iflag = 0 >*/
    iflag = 0;
/*<       nfev = 0 >*/
    *nfev = 0;

/*     check the input parameters for errors. */

/*<    >*/
    if (*n <= 0 || *m < *n || *ldfjac < *m || *ftol < zero || *xtol < zero ||
	    *gtol < zero || *maxfev <= 0 || *factor <= zero) {
	goto L300;
    }
/*<       if (mode .ne. 2) go to 20 >*/
    if (*mode != 2) {
	goto L20;
    }
/*<       do 10 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          if (diag(j) .le. zero) go to 300 >*/
	if (diag[j] <= zero) {
	    goto L300;
	}
/*<    10    continue >*/
/* L10: */
    }
/*<    20 continue >*/
L20:

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

/*<       iflag = 1 >*/
    iflag = 1;
/*<       call fcn(m,n,x,fvec,iflag) >*/
    fret=(*fcn)((int) *n, &x[1], (int) *m, &fvec[1], up);
    if (fret < 0)
      iflag=fret;
/*<       nfev = 1 >*/
    *nfev = 1;
/*<       if (iflag .lt. 0) go to 300 >*/
    if (iflag < 0) {
	goto L300;
    }
/*<       fnorm = enorm(m,fvec) >*/
    fnorm = enorm_cvkit(m, &fvec[1]);

/*     initialize levenberg-marquardt parameter and iteration counter. */

/*<       par = zero >*/
    par = zero;
/*<       iter = 1 >*/
    iter = 1;

/*     beginning of the outer loop. */

/*<    30 continue >*/
L30:

/*        calculate the jacobian matrix. */

/*<          iflag = 2 >*/
    iflag = 2;
/*<          call fdjac2(fcn,m,n,x,fvec,fjac,ldfjac,iflag,epsfcn,wa4) >*/
    fdjac2_cvkit((S_fp)fcn, m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &
	    iflag, epsfcn, &wa4[1], up);
/*<          nfev = nfev + n >*/
    *nfev += *n;
/*<          if (iflag .lt. 0) go to 300 >*/
    if (iflag < 0) {
	goto L300;
    }

/*        if requested, call fcn to enable printing of iterates. */

/*<          if (nprint .le. 0) go to 40 >*/
    if (*nprint <= 0) {
	goto L40;
    }
/*<          iflag = 0 >*/
    iflag = 0;
/*<          if (mod(iter-1,nprint) .eq. 0) call fcn(m,n,x,fvec,iflag) >*/
    if ((iter - 1) % *nprint == 0) {
	fret=(*fcn)((int) *n, &x[1], (int) *m, &fvec[1], up);
	if (fret < 0)
	  iflag=fret;
    }
/*<          if (iflag .lt. 0) go to 300 >*/
    if (iflag < 0) {
	goto L300;
    }
/*<    40    continue >*/
L40:

/*        compute the qr factorization of the jacobian. */

/*<          call qrfac(m,n,fjac,ldfjac,.true.,ipvt,n,wa1,wa2,wa3) >*/
    qrfac_cvkit(m, n, &fjac[fjac_offset], ldfjac, &c_true, &ipvt[1], n, &wa1[1], &
	    wa2[1], &wa3[1]);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

/*<          if (iter .ne. 1) go to 80 >*/
    if (iter != 1) {
	goto L80;
    }
/*<          if (mode .eq. 2) go to 60 >*/
    if (*mode == 2) {
	goto L60;
    }
/*<          do 50 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             diag(j) = wa2(j) >*/
	diag[j] = wa2[j];
/*<             if (wa2(j) .eq. zero) diag(j) = one >*/
	if (wa2[j] == zero) {
	    diag[j] = one;
	}
/*<    50       continue >*/
/* L50: */
    }
/*<    60    continue >*/
L60:

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

/*<          do 70 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             wa3(j) = diag(j)*x(j) >*/
	wa3[j] = diag[j] * x[j];
/*<    70       continue >*/
/* L70: */
    }
/*<          xnorm = enorm(n,wa3) >*/
    xnorm = enorm_cvkit(n, &wa3[1]);
/*<          delta = factor*xnorm >*/
    delta = *factor * xnorm;
/*<          if (delta .eq. zero) delta = factor >*/
    if (delta == zero) {
	delta = *factor;
    }
/*<    80    continue >*/
L80:

/*        form (q transpose)*fvec and store the first n components in */
/*        qtf. */

/*<          do 90 i = 1, m >*/
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
/*<             wa4(i) = fvec(i) >*/
	wa4[i__] = fvec[i__];
/*<    90       continue >*/
/* L90: */
    }
/*<          do 130 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             if (fjac(j,j) .eq. zero) go to 120 >*/
	if (fjac[j + j * fjac_dim1] == zero) {
	    goto L120;
	}
/*<             sum = zero >*/
	sum = zero;
/*<             do 100 i = j, m >*/
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
/*<                sum = sum + fjac(i,j)*wa4(i) >*/
	    sum += fjac[i__ + j * fjac_dim1] * wa4[i__];
/*<   100          continue >*/
/* L100: */
	}
/*<             temp = -sum/fjac(j,j) >*/
	temp = -sum / fjac[j + j * fjac_dim1];
/*<             do 110 i = j, m >*/
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
/*<                wa4(i) = wa4(i) + fjac(i,j)*temp >*/
	    wa4[i__] += fjac[i__ + j * fjac_dim1] * temp;
/*<   110          continue >*/
/* L110: */
	}
/*<   120       continue >*/
L120:
/*<             fjac(j,j) = wa1(j) >*/
	fjac[j + j * fjac_dim1] = wa1[j];
/*<             qtf(j) = wa4(j) >*/
	qtf[j] = wa4[j];
/*<   130       continue >*/
/* L130: */
    }

/*        compute the norm of the scaled gradient. */

/*<          gnorm = zero >*/
    gnorm = zero;
/*<          if (fnorm .eq. zero) go to 170 >*/
    if (fnorm == zero) {
	goto L170;
    }
/*<          do 160 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             l = ipvt(j) >*/
	l = ipvt[j];
/*<             if (wa2(l) .eq. zero) go to 150 >*/
	if (wa2[l] == zero) {
	    goto L150;
	}
/*<             sum = zero >*/
	sum = zero;
/*<             do 140 i = 1, j >*/
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<                sum = sum + fjac(i,j)*(qtf(i)/fnorm) >*/
	    sum += fjac[i__ + j * fjac_dim1] * (qtf[i__] / fnorm);
/*<   140          continue >*/
/* L140: */
	}
/*<             gnorm = dmax1(gnorm,dabs(sum/wa2(l))) >*/
/* Computing MAX */
	d__2 = gnorm, d__3 = (d__1 = sum / wa2[l], abs(d__1));
	gnorm = max(d__2,d__3);
/*<   150       continue >*/
L150:
/*<   160       continue >*/
/* L160: */
	;
    }
/*<   170    continue >*/
L170:

/*        test for convergence of the gradient norm. */

/*<          if (gnorm .le. gtol) info = 4 >*/
    if (gnorm <= *gtol) {
	*info = 4;
    }
/*<          if (info .ne. 0) go to 300 >*/
    if (*info != 0) {
	goto L300;
    }

/*        rescale if necessary. */

/*<          if (mode .eq. 2) go to 190 >*/
    if (*mode == 2) {
	goto L190;
    }
/*<          do 180 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             diag(j) = dmax1(diag(j),wa2(j)) >*/
/* Computing MAX */
	d__1 = diag[j], d__2 = wa2[j];
	diag[j] = max(d__1,d__2);
/*<   180       continue >*/
/* L180: */
    }
/*<   190    continue >*/
L190:

/*        beginning of the inner loop. */

/*<   200    continue >*/
L200:

/*           determine the levenberg-marquardt parameter. */

/*<    >*/
    lmpar_cvkit(n, &fjac[fjac_offset], ldfjac, &ipvt[1], &diag[1], &qtf[1], &delta,
	     &par, &wa1[1], &wa2[1], &wa3[1], &wa4[1]);

/*           store the direction p and x + p. calculate the norm of p. */

/*<             do 210 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<                wa1(j) = -wa1(j) >*/
	wa1[j] = -wa1[j];
/*<                wa2(j) = x(j) + wa1(j) >*/
	wa2[j] = x[j] + wa1[j];
/*<                wa3(j) = diag(j)*wa1(j) >*/
	wa3[j] = diag[j] * wa1[j];
/*<   210          continue >*/
/* L210: */
    }
/*<             pnorm = enorm(n,wa3) >*/
    pnorm = enorm_cvkit(n, &wa3[1]);

/*           on the first iteration, adjust the initial step bound. */

/*<             if (iter .eq. 1) delta = dmin1(delta,pnorm) >*/
    if (iter == 1) {
	delta = min(delta,pnorm);
    }

/*           evaluate the function at x + p and calculate its norm. */

/*<             iflag = 1 >*/
    iflag = 1;
/*<             call fcn(m,n,wa2,wa4,iflag) >*/
    fret=(*fcn)((int) *n, &wa2[1], (int) *m, &wa4[1], up);
    if (fret < 0)
      fret=iflag;
/*<             nfev = nfev + 1 >*/
    ++(*nfev);
/*<             if (iflag .lt. 0) go to 300 >*/
    if (iflag < 0) {
	goto L300;
    }
/*<             fnorm1 = enorm(m,wa4) >*/
    fnorm1 = enorm_cvkit(m, &wa4[1]);

/*           compute the scaled actual reduction. */

/*<             actred = -one >*/
    actred = -one;
/*<             if (p1*fnorm1 .lt. fnorm) actred = one - (fnorm1/fnorm)**2 >*/
    if (p1 * fnorm1 < fnorm) {
/* Computing 2nd power */
	d__1 = fnorm1 / fnorm;
	actred = one - d__1 * d__1;
    }

/*           compute the scaled predicted reduction and */
/*           the scaled directional derivative. */

/*<             do 230 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<                wa3(j) = zero >*/
	wa3[j] = zero;
/*<                l = ipvt(j) >*/
	l = ipvt[j];
/*<                temp = wa1(l) >*/
	temp = wa1[l];
/*<                do 220 i = 1, j >*/
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<                   wa3(i) = wa3(i) + fjac(i,j)*temp >*/
	    wa3[i__] += fjac[i__ + j * fjac_dim1] * temp;
/*<   220             continue >*/
/* L220: */
	}
/*<   230          continue >*/
/* L230: */
    }
/*<             temp1 = enorm(n,wa3)/fnorm >*/
    temp1 = enorm_cvkit(n, &wa3[1]) / fnorm;
/*<             temp2 = (dsqrt(par)*pnorm)/fnorm >*/
    temp2 = sqrt(par) * pnorm / fnorm;
/*<             prered = temp1**2 + temp2**2/p5 >*/
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    prered = d__1 * d__1 + d__2 * d__2 / p5;
/*<             dirder = -(temp1**2 + temp2**2) >*/
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    dirder = -(d__1 * d__1 + d__2 * d__2);

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

/*<             ratio = zero >*/
    ratio = zero;
/*<             if (prered .ne. zero) ratio = actred/prered >*/
    if (prered != zero) {
	ratio = actred / prered;
    }

/*           update the step bound. */

/*<             if (ratio .gt. p25) go to 240 >*/
    if (ratio > p25) {
	goto L240;
    }
/*<                if (actred .ge. zero) temp = p5 >*/
    if (actred >= zero) {
	temp = p5;
    }
/*<    >*/
    if (actred < zero) {
	temp = p5 * dirder / (dirder + p5 * actred);
    }
/*<                if (p1*fnorm1 .ge. fnorm .or. temp .lt. p1) temp = p1 >*/
    if (p1 * fnorm1 >= fnorm || temp < p1) {
	temp = p1;
    }
/*<                delta = temp*dmin1(delta,pnorm/p1) >*/
/* Computing MIN */
    d__1 = delta, d__2 = pnorm / p1;
    delta = temp * min(d__1,d__2);
/*<                par = par/temp >*/
    par /= temp;
/*<                go to 260 >*/
    goto L260;
/*<   240       continue >*/
L240:
/*<                if (par .ne. zero .and. ratio .lt. p75) go to 250 >*/
    if (par != zero && ratio < p75) {
	goto L250;
    }
/*<                delta = pnorm/p5 >*/
    delta = pnorm / p5;
/*<                par = p5*par >*/
    par = p5 * par;
/*<   250          continue >*/
L250:
/*<   260       continue >*/
L260:

/*           test for successful iteration. */

/*<             if (ratio .lt. p0001) go to 290 >*/
    if (ratio < p0001) {
	goto L290;
    }

/*           successful iteration. update x, fvec, and their norms. */

/*<             do 270 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<                x(j) = wa2(j) >*/
	x[j] = wa2[j];
/*<                wa2(j) = diag(j)*x(j) >*/
	wa2[j] = diag[j] * x[j];
/*<   270          continue >*/
/* L270: */
    }
/*<             do 280 i = 1, m >*/
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
/*<                fvec(i) = wa4(i) >*/
	fvec[i__] = wa4[i__];
/*<   280          continue >*/
/* L280: */
    }
/*<             xnorm = enorm(n,wa2) >*/
    xnorm = enorm_cvkit(n, &wa2[1]);
/*<             fnorm = fnorm1 >*/
    fnorm = fnorm1;
/*<             iter = iter + 1 >*/
    ++iter;
/*<   290       continue >*/
L290:

/*           tests for convergence. */

/*<    >*/
    if (abs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= one) {
	*info = 1;
    }
/*<             if (delta .le. xtol*xnorm) info = 2 >*/
    if (delta <= *xtol * xnorm) {
	*info = 2;
    }
/*<    >*/
    if (abs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= one && *info
	    == 2) {
	*info = 3;
    }
/*<             if (info .ne. 0) go to 300 >*/
    if (*info != 0) {
	goto L300;
    }

/*           tests for termination and stringent tolerances. */

/*<             if (nfev .ge. maxfev) info = 5 >*/
    if (*nfev >= *maxfev) {
	*info = 5;
    }
/*<    >*/
    if (abs(actred) <= epsmch && prered <= epsmch && p5 * ratio <= one) {
	*info = 6;
    }
/*<             if (delta .le. epsmch*xnorm) info = 7 >*/
    if (delta <= epsmch * xnorm) {
	*info = 7;
    }
/*<             if (gnorm .le. epsmch) info = 8 >*/
    if (gnorm <= epsmch) {
	*info = 8;
    }
/*<             if (info .ne. 0) go to 300 >*/
    if (*info != 0) {
	goto L300;
    }

/*           end of the inner loop. repeat if iteration unsuccessful. */

/*<             if (ratio .lt. p0001) go to 200 >*/
    if (ratio < p0001) {
	goto L200;
    }

/*        end of the outer loop. */

/*<          go to 30 >*/
    goto L30;
/*<   300 continue >*/
L300:

/*     termination, either normal or user imposed. */

/*<       if (iflag .lt. 0) info = iflag >*/
    if (iflag < 0) {
	*info = iflag;
    }
/*<       iflag = 0 >*/
    iflag = 0;
/*<       if (nprint .gt. 0) call fcn(m,n,x,fvec,iflag) >*/
    if (*nprint > 0) {
	fret=(*fcn)((int) *n, &x[1], (int) *m, &fvec[1]);
	if (fret < 0)
	  iflag=fret;
    }
/*<       return >*/
    return 0;

/*     last card of subroutine lmdif. */

/*<       end >*/
}